

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::EdgeCircumcenterSign(S2Point *x0,S2Point *x1,S2Point *a,S2Point *b,S2Point *c)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  int abc_sign;
  int iVar9;
  long lVar10;
  double *ap;
  double *ap_2;
  bool bVar11;
  double *ap_3;
  double *ap_4;
  undefined1 local_138 [16];
  longdouble local_128;
  longdouble local_118;
  Vector3_xf local_108;
  Vector3_xf local_d8;
  Vector3_xf local_a8;
  Vector3_xf local_78;
  S2LogMessage local_40;
  
  local_138._0_8_ = -x1->c_[0];
  local_138._10_6_ = (uint6)((ulong)x1->c_[1] >> 0x10) ^ 0x800000000000;
  local_138._8_2_ = SUB82(x1->c_[1],0);
  local_128 = (longdouble)CONCAT28(local_128._8_2_,-x1->c_[2]);
  if ((x0->c_[0] != (double)local_138._0_8_) || (NAN(x0->c_[0]) || NAN((double)local_138._0_8_))) {
    bVar11 = true;
  }
  else {
    lVar10 = 0;
    do {
      bVar11 = lVar10 == 0x10;
      if (bVar11) goto LAB_00219ed2;
      dVar2 = *(double *)((long)x0->c_ + lVar10 + 8);
      lVar8 = lVar10 + 8;
      lVar10 = lVar10 + 8;
    } while ((dVar2 == *(double *)(local_138 + lVar8)) &&
            (!NAN(dVar2) && !NAN(*(double *)(local_138 + lVar8))));
    bVar11 = false;
LAB_00219ed2:
    bVar11 = (bool)(bVar11 ^ 1);
  }
  if (!bVar11) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x426,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: (x0) != (-x1) ",0x1c);
    abort();
  }
  abc_sign = Sign(a,b,c);
  iVar9 = TriageEdgeCircumcenterSign<double>(x0,x1,a,b,c,abc_sign);
  if (iVar9 == 0) {
    dVar2 = x0->c_[0];
    dVar3 = x1->c_[0];
    if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
      lVar10 = 0;
      do {
        if (lVar10 == 0x10) {
          return 0;
        }
        dVar4 = *(double *)((long)x0->c_ + lVar10 + 8);
        pdVar1 = (double *)((long)x1->c_ + lVar10 + 8);
        lVar10 = lVar10 + 8;
      } while ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1)));
    }
    dVar4 = a->c_[0];
    dVar5 = b->c_[0];
    if ((dVar4 == dVar5) && (!NAN(dVar4) && !NAN(dVar5))) {
      lVar10 = 0;
      do {
        if (lVar10 == 0x10) {
          return 0;
        }
        dVar6 = *(double *)((long)a->c_ + lVar10 + 8);
        pdVar1 = (double *)((long)b->c_ + lVar10 + 8);
        lVar10 = lVar10 + 8;
      } while ((dVar6 == *pdVar1) && (!NAN(dVar6) && !NAN(*pdVar1)));
    }
    dVar6 = c->c_[0];
    if ((dVar5 == dVar6) && (!NAN(dVar5) && !NAN(dVar6))) {
      lVar10 = 0;
      do {
        if (lVar10 == 0x10) {
          return 0;
        }
        dVar7 = *(double *)((long)b->c_ + lVar10 + 8);
        pdVar1 = (double *)((long)c->c_ + lVar10 + 8);
        lVar10 = lVar10 + 8;
      } while ((dVar7 == *pdVar1) && (!NAN(dVar7) && !NAN(*pdVar1)));
    }
    if ((dVar6 == dVar4) && (!NAN(dVar6) && !NAN(dVar4))) {
      lVar10 = 0;
      do {
        if (lVar10 == 0x10) {
          return 0;
        }
        dVar7 = *(double *)((long)c->c_ + lVar10 + 8);
        pdVar1 = (double *)((long)a->c_ + lVar10 + 8);
        lVar10 = lVar10 + 8;
      } while ((dVar7 == *pdVar1) && (!NAN(dVar7) && !NAN(*pdVar1)));
    }
    local_128 = (longdouble)x0->c_[1];
    local_118 = (longdouble)x0->c_[2];
    local_138._0_8_ = SUB108((longdouble)dVar2,0);
    local_138._8_2_ = (undefined2)((unkuint10)(longdouble)dVar2 >> 0x40);
    local_78.c_[0]._0_10_ = (BADTYPE)dVar3;
    local_78.c_[1]._0_10_ = (BADTYPE)x1->c_[1];
    local_78.c_[2]._0_10_ = (BADTYPE)x1->c_[2];
    local_a8.c_[0]._0_10_ = (BADTYPE)dVar4;
    local_a8.c_[1]._0_10_ = (BADTYPE)a->c_[1];
    local_a8.c_[2]._0_10_ = (BADTYPE)a->c_[2];
    local_d8.c_[0]._0_10_ = (BADTYPE)dVar5;
    local_d8.c_[1]._0_10_ = (BADTYPE)b->c_[1];
    local_d8.c_[2]._0_10_ = (BADTYPE)b->c_[2];
    local_108.c_[0]._0_10_ = (BADTYPE)dVar6;
    local_108.c_[1]._0_10_ = (BADTYPE)c->c_[1];
    local_108.c_[2]._0_10_ = (BADTYPE)c->c_[2];
    iVar9 = TriageEdgeCircumcenterSign<long_double>
                      ((Vector3<long_double> *)local_138,(Vector3<long_double> *)&local_78,
                       (Vector3<long_double> *)&local_a8,(Vector3<long_double> *)&local_d8,
                       (Vector3<long_double> *)&local_108,abc_sign);
    if (iVar9 == 0) {
      util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
      GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                (local_138,(BasicVector<Vector3,ExactFloat,3ul> *)x0);
      util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
      GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                (&local_78,(BasicVector<Vector3,ExactFloat,3ul> *)x1);
      util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
      GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                (&local_a8,(BasicVector<Vector3,ExactFloat,3ul> *)a);
      util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
      GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                (&local_d8,(BasicVector<Vector3,ExactFloat,3ul> *)b);
      util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
      GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                (&local_108,(BasicVector<Vector3,ExactFloat,3ul> *)c);
      iVar9 = ExactEdgeCircumcenterSign
                        ((Vector3_xf *)local_138,&local_78,&local_a8,&local_d8,&local_108,abc_sign);
      Vector3<ExactFloat>::~Vector3(&local_108);
      Vector3<ExactFloat>::~Vector3(&local_d8);
      Vector3<ExactFloat>::~Vector3(&local_a8);
      Vector3<ExactFloat>::~Vector3(&local_78);
      Vector3<ExactFloat>::~Vector3((Vector3<ExactFloat> *)local_138);
      if (iVar9 == 0) {
        iVar9 = SymbolicEdgeCircumcenterSign(x0,x1,a,b,c);
      }
    }
  }
  return iVar9;
}

Assistant:

int EdgeCircumcenterSign(const S2Point& x0, const S2Point& x1,
                         const S2Point& a, const S2Point& b,
                         const S2Point& c) {
  // Check that the edge does not consist of antipodal points.  (This catches
  // the most common case -- the full test is in ExactEdgeCircumcenterSign.)
  S2_DCHECK_NE(x0, -x1);

  int abc_sign = Sign(a, b, c);
  int sign = TriageEdgeCircumcenterSign(x0, x1, a, b, c, abc_sign);
  if (sign != 0) return sign;

  // Optimization for the cases that are going to return zero anyway, in order
  // to avoid falling back to exact arithmetic.
  if (x0 == x1 || a == b || b == c || c == a) return 0;

  sign = TriageEdgeCircumcenterSign(
      ToLD(x0), ToLD(x1), ToLD(a), ToLD(b), ToLD(c), abc_sign);
  if (sign != 0) return sign;
  sign = ExactEdgeCircumcenterSign(
      ToExact(x0), ToExact(x1), ToExact(a), ToExact(b), ToExact(c), abc_sign);
  if (sign != 0) return sign;

  // Unlike the other methods, SymbolicEdgeCircumcenterSign does not depend
  // on the sign of triangle ABC.
  return SymbolicEdgeCircumcenterSign(x0, x1, a, b, c);
}